

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpExtraHeaders.c
# Opt level: O3

int UpnpExtraHeaders_assign(UpnpExtraHeaders *p,UpnpExtraHeaders *q)

{
  UpnpListHead *pUVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (p == q) {
    iVar3 = 1;
  }
  else {
    pUVar1 = (q->m_node).prev;
    (p->m_node).next = (q->m_node).next;
    (p->m_node).prev = pUVar1;
    pcVar4 = UpnpString_get_String(q->m_name);
    iVar2 = UpnpString_set_String(p->m_name,pcVar4);
    iVar3 = 0;
    if (iVar2 != 0) {
      pcVar4 = UpnpString_get_String(q->m_value);
      iVar2 = UpnpString_set_String(p->m_value,pcVar4);
      iVar3 = 0;
      if (iVar2 != 0) {
        iVar3 = UpnpExtraHeaders_set_resp(p,q->m_resp);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int UpnpExtraHeaders_assign(UpnpExtraHeaders *p, const UpnpExtraHeaders *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     UpnpExtraHeaders_set_node(p, UpnpExtraHeaders_get_node(q));
		ok = ok &&
		     UpnpExtraHeaders_set_name(p, UpnpExtraHeaders_get_name(q));
		ok = ok && UpnpExtraHeaders_set_value(
				   p, UpnpExtraHeaders_get_value(q));
		ok = ok &&
		     UpnpExtraHeaders_set_resp(p, UpnpExtraHeaders_get_resp(q));
	}

	return ok;
}